

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_1.h
# Opt level: O0

void __thiscall
dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
          (queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *this,
          file *item)

{
  file *a;
  file *in_RDI;
  node *temp;
  
  a = (file *)operator_new(0x58);
  node::node((node *)0x487a91);
  exchange<dlib::file>(a,in_RDI);
  if (*(long *)&(in_RDI->state).field_0x20 == 0) {
    *(file **)&(in_RDI->state).field_0x18 = a;
  }
  else {
    **(undefined8 **)&(in_RDI->state).field_0x10 = a;
  }
  *(file **)&(in_RDI->state).field_0x10 = a;
  *(long *)&(in_RDI->state).field_0x20 = *(long *)&(in_RDI->state).field_0x20 + 1;
  (**(code **)((in_RDI->state).file_size + 0x18))();
  return;
}

Assistant:

void queue_kernel_1<T,mem_manager>::
    enqueue (
        T& item
    )
    {
        // make new node
        node* temp = new node;

        // swap item into new node
        exchange(item,temp->item);
        
        if (queue_size == 0)
            out = temp;
        else
            in->last = temp;

        // make in point to the new node
        in = temp;
        
        ++queue_size;

        // put the enumerator at the start
        reset();
    }